

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::PrintTo(float f,ostream *os)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  
  lVar1 = *(long *)(*(long *)os + -0x18);
  uVar2 = *(undefined8 *)(os + lVar1 + 8);
  iVar3 = AppropriateResolution<float>(f);
  *(long *)(os + lVar1 + 8) = (long)iVar3;
  std::ostream::operator<<(os,f);
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = uVar2;
  return;
}

Assistant:

inline void PrintTo(float f, ::std::ostream* os) {
  auto old_precision = os->precision();
  os->precision(AppropriateResolution(f));
  *os << f;
  os->precision(old_precision);
}